

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi.cpp
# Opt level: O3

void __thiscall curlpp::Multi::add(Multi *this,Easy *handle)

{
  CURLM *pCVar1;
  int iVar2;
  CURL *pCVar3;
  RuntimeError *this_00;
  char *reason;
  pair<void_*,_const_curlpp::Easy_*> local_28;
  
  pCVar1 = this->mMultiHandle;
  pCVar3 = Easy::getHandle(handle);
  iVar2 = curl_multi_add_handle(pCVar1,pCVar3);
  if (0xfffffffd < iVar2 - 1U) {
    local_28.first = Easy::getHandle(handle);
    local_28.second = handle;
    std::
    _Rb_tree<void*,std::pair<void*const,curlpp::Easy_const*>,std::_Select1st<std::pair<void*const,curlpp::Easy_const*>>,std::less<void*>,std::allocator<std::pair<void*const,curlpp::Easy_const*>>>
    ::_M_emplace_unique<std::pair<void*,curlpp::Easy_const*>>
              ((_Rb_tree<void*,std::pair<void*const,curlpp::Easy_const*>,std::_Select1st<std::pair<void*const,curlpp::Easy_const*>>,std::less<void*>,std::allocator<std::pair<void*const,curlpp::Easy_const*>>>
                *)&this->mHandles,&local_28);
    return;
  }
  this_00 = (RuntimeError *)__cxa_allocate_exception(0x10);
  reason = (char *)curl_multi_strerror(iVar2);
  RuntimeError::RuntimeError(this_00,reason);
  __cxa_throw(this_00,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

void
curlpp::Multi::add(const curlpp::Easy * handle)
{
  CURLMcode code = curl_multi_add_handle(mMultiHandle, handle->getHandle());
  if(code != CURLM_CALL_MULTI_PERFORM) {
    if(code != CURLM_OK) {
      throw curlpp::RuntimeError(curl_multi_strerror(code));
    }
  }
  mHandles.insert(std::make_pair(handle->getHandle(),handle));
}